

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

ProfiledInstr * IR::ProfiledInstr::New(OpCode opcode,Opnd *dstOpnd,Opnd *src1Opnd,Func *func)

{
  ProfiledInstr *this;
  
  this = (ProfiledInstr *)new<Memory::JitArenaAllocator>(0x60,func->m_alloc,0x3d6ef4);
  ProfiledInstr(this,false);
  Instr::Init((Instr *)this,opcode,InstrKindProfiled,func);
  if (dstOpnd != (Opnd *)0x0) {
    Instr::SetDst((Instr *)this,dstOpnd);
  }
  if (src1Opnd != (Opnd *)0x0) {
    Instr::SetSrc1((Instr *)this,src1Opnd);
  }
  (this->u).ldElemInfo = (LdElemInfo *)0x0;
  return this;
}

Assistant:

ProfiledInstr *
ProfiledInstr::New(Js::OpCode opcode, Opnd *dstOpnd, Opnd *src1Opnd, Func * func)
{
    ProfiledInstr * profiledInstr = JitAnew(func->m_alloc, IR::ProfiledInstr);
    profiledInstr->Init(opcode, InstrKindProfiled, func);

    if (dstOpnd)
    {
        profiledInstr->SetDst(dstOpnd);
    }
    if (src1Opnd)
    {
        profiledInstr->SetSrc1(src1Opnd);
    }

    profiledInstr->u.ldElemInfo = nullptr;
    return profiledInstr;
}